

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<-18>,_boost::random::detail::M3<-14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<-24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<-1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<_18>,_boost::random::detail::M3<_14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<_24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<_1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
             *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar9 = this->index_;
  if (uVar9 < 0x26) {
    uVar3 = uVar9 - 0x13;
    if (uVar9 < 0x13) {
      uVar3 = uVar9;
    }
    uVar9 = uVar3 + 0x12;
    if ((((uVar9 < 0x26) && (uVar4 = uVar3 + 0x11, uVar4 < 0x26)) &&
        (uVar6 = uVar3 + 0x10, uVar6 < 0x26)) && (uVar1 = uVar3 + 0xd, uVar1 < 0x26)) {
      uVar8 = uVar3 - 3;
      if (uVar6 < 0x13) {
        uVar8 = uVar6;
      }
      uVar6 = uVar3 - 2;
      if (uVar4 < 0x13) {
        uVar6 = uVar4;
      }
      uVar4 = uVar3 - 1;
      if (uVar9 < 0x13) {
        uVar4 = uVar9;
      }
      uVar9 = uVar3 - 6;
      if (uVar1 < 0x13) {
        uVar9 = uVar1;
      }
      uVar5 = this->state_[uVar6] & 1 | this->state_[uVar4] & 0xfffffffe;
      uVar2 = this->state_[uVar8] << 0xe ^
              this->state_[uVar3] << 0x12 ^ this->state_[uVar3] ^ this->state_[uVar8];
      uVar7 = this->state_[uVar9] >> 0x12 ^ this->state_[uVar9];
      uVar5 = uVar2 ^ uVar5 ^ uVar2 >> 5 ^ uVar7 ^ uVar7 * 2 ^ uVar5 << 0x18;
      this->state_[uVar3] = uVar2 ^ uVar7;
      this->state_[uVar4] = uVar5;
      this->index_ = uVar4;
      return uVar5;
    }
  }
  __assert_fail("(value < 2 * r)&&(\"value out of range\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/well.hpp",
                0xd5,
                "static UIntType boost::random::detail::generic_modulo<unsigned long, 19>::compute(UIntType) [UIntType = unsigned long, r = 19]"
               );
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }